

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

int __thiscall jpgd::jpeg_decoder::init_scan(jpeg_decoder *this)

{
  bool bVar1;
  int iVar2;
  jpeg_decoder *in_RDI;
  jpeg_decoder *this_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  this_00 = in_RDI;
  iVar2 = locate_sos_marker((jpeg_decoder *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    bVar1 = calc_mcu_block_order(in_RDI);
    if (bVar1) {
      check_huff_tables(this_00);
      check_quant_tables(this_00);
      memset(in_RDI->m_last_dc_val,0,(long)in_RDI->m_comps_in_frame << 2);
      in_RDI->m_eob_run = 0;
      if (in_RDI->m_restart_interval != 0) {
        in_RDI->m_restarts_left = in_RDI->m_restart_interval;
        in_RDI->m_next_restart_num = 0;
      }
      fix_in_buffer(this_00);
      iVar2 = 1;
    }
    else {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int jpeg_decoder::init_scan()
	{
		if (!locate_sos_marker())
			return JPGD_FALSE;

		if (!calc_mcu_block_order())
			return JPGD_FALSE;

		check_huff_tables();

		check_quant_tables();

		memset(m_last_dc_val, 0, m_comps_in_frame * sizeof(uint));

		m_eob_run = 0;

		if (m_restart_interval)
		{
			m_restarts_left = m_restart_interval;
			m_next_restart_num = 0;
		}

		fix_in_buffer();

		return JPGD_TRUE;
	}